

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int skipcomment(LoadF *lf,int *cp)

{
  int iVar1;
  bool local_25;
  int c;
  int *cp_local;
  LoadF *lf_local;
  
  iVar1 = skipBOM(lf);
  *cp = iVar1;
  if (iVar1 == 0x23) {
    do {
      iVar1 = getc((FILE *)lf->f);
      local_25 = iVar1 != -1 && iVar1 != 10;
    } while (local_25);
    iVar1 = getc((FILE *)lf->f);
    *cp = iVar1;
    lf_local._4_4_ = 1;
  }
  else {
    lf_local._4_4_ = 0;
  }
  return lf_local._4_4_;
}

Assistant:

static int skipcomment(LoadF *lf, int *cp) {
    int c = *cp = skipBOM(lf);
    if (c == '#') {  /* first line is a comment (Unix exec. file)? */
        do {  /* skip first line */
            c = getc(lf->f);
        } while (c != EOF && c != '\n');
        *cp = getc(lf->f);  /* skip end-of-line, if present */
        return 1;  /* there was a comment */
    } else return 0;  /* no comment */
}